

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * cmsys::SystemTools::AppendStrings(char *str1,char *str2)

{
  size_t sVar1;
  size_t sVar2;
  char *newstr;
  size_t len1;
  char *str2_local;
  char *str1_local;
  
  if (str1 == (char *)0x0) {
    str1_local = DuplicateString(str2);
  }
  else if (str2 == (char *)0x0) {
    str1_local = DuplicateString(str1);
  }
  else {
    sVar1 = strlen(str1);
    sVar2 = strlen(str2);
    str1_local = (char *)operator_new__(sVar1 + sVar2 + 1);
    if (str1_local == (char *)0x0) {
      str1_local = (char *)0x0;
    }
    else {
      strcpy(str1_local,str1);
      strcat(str1_local + sVar1,str2);
    }
  }
  return str1_local;
}

Assistant:

char* SystemTools::AppendStrings(const char* str1, const char* str2)
{
  if (!str1) {
    return SystemTools::DuplicateString(str2);
  }
  if (!str2) {
    return SystemTools::DuplicateString(str1);
  }
  size_t len1 = strlen(str1);
  char* newstr = new char[len1 + strlen(str2) + 1];
  if (!newstr) {
    return KWSYS_NULLPTR;
  }
  strcpy(newstr, str1);
  strcat(newstr + len1, str2);
  return newstr;
}